

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O2

void __thiscall
Memory::AutoBooleanToggle::AutoBooleanToggle
          (AutoBooleanToggle *this,bool *b,bool value,bool valueMayChange)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  this->b = b;
  if (*b == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                       ,0x2f,"(!(*b))","!(*b)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *b = value;
  this->value = value;
  this->valueMayChange = valueMayChange;
  return;
}

Assistant:

AutoBooleanToggle(bool * b, bool value = true, bool valueMayChange = false)
        : b(b)
    {
        Assert(!(*b));
        *b = value;
#if DBG
        this->value = value;
        this->valueMayChange = valueMayChange;
#endif
    }